

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O0

int cmCTestLaunch::Main(int argc,char **argv)

{
  ostream *this;
  undefined1 local_268 [8];
  cmCTestLaunch self;
  char **argv_local;
  int argc_local;
  
  self.SourceDir.field_2._8_8_ = argv;
  if (argc == 2) {
    this = std::operator<<((ostream *)&std::cerr,
                           "ctest --launch: this mode is for internal CTest use only");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  else {
    cmCTestLaunch((cmCTestLaunch *)local_268,argc,argv);
    argv_local._4_4_ = Run((cmCTestLaunch *)local_268);
    ~cmCTestLaunch((cmCTestLaunch *)local_268);
  }
  return argv_local._4_4_;
}

Assistant:

int cmCTestLaunch::Main(int argc, const char* const argv[])
{
  if(argc == 2)
    {
    std::cerr << "ctest --launch: this mode is for internal CTest use only"
              << std::endl;
    return 1;
    }
  cmCTestLaunch self(argc, argv);
  return self.Run();
}